

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O2

void __thiscall Qentem::QExpression::operator|=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  QExpression *pQVar2;
  
  EVar1 = this->Type;
  if (EVar1 == RealNumber) {
    if (right->Type - 2 < 2) {
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((long)*(double *)&this->field_0 | (ulong)(right->field_0).SubExpressions.storage_);
    }
    else {
      if (right->Type != RealNumber) {
        return;
      }
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)((long)*(double *)&right->field_0 | (long)*(double *)&this->field_0);
    }
    goto LAB_00113a4d;
  }
  if (EVar1 == IntegerNumber) {
    if (right->Type != RealNumber) {
LAB_00113a29:
      (this->field_0).SubExpressions.storage_ =
           (QExpression *)
           ((ulong)(this->field_0).SubExpressions.storage_ |
           (ulong)(right->field_0).SubExpressions.storage_);
      return;
    }
LAB_00113a09:
    pQVar2 = (QExpression *)(long)*(double *)&right->field_0;
  }
  else {
    if (EVar1 != NaturalNumber) {
      return;
    }
    EVar1 = right->Type;
    if (EVar1 == RealNumber) goto LAB_00113a09;
    if (EVar1 != IntegerNumber) {
      if (EVar1 != NaturalNumber) {
        return;
      }
      goto LAB_00113a29;
    }
    pQVar2 = (right->field_0).SubExpressions.storage_;
  }
  (this->field_0).SubExpressions.storage_ =
       (QExpression *)((ulong)(this->field_0).SubExpressions.storage_ | (ulong)pQVar2);
LAB_00113a4d:
  this->Type = IntegerNumber;
  return;
}

Assistant:

void operator|=(const QExpression &right) noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber: {
                        Value.Number.Natural |= right.Value.Number.Natural;
                        break;
                    }

                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer |= right.Value.Number.Integer;
                        Type = ExpressionType::IntegerNumber;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Integer |= SizeT64I(right.Value.Number.Real);
                        Type = ExpressionType::IntegerNumber;
                        break;
                    }

                    default: {
                    }
                }

                break;
            }

            case ExpressionType::IntegerNumber: {
                if (right.Type == ExpressionType::RealNumber) {
                    Value.Number.Integer |= SizeT64I(right.Value.Number.Real);
                    Type = ExpressionType::IntegerNumber;
                } else {
                    Value.Number.Integer |= right.Value.Number.Integer;
                }

                break;
            }

            case ExpressionType::RealNumber: {
                switch (right.Type) {
                    case ExpressionType::NaturalNumber:
                    case ExpressionType::IntegerNumber: {
                        Value.Number.Integer = SizeT64I(Value.Number.Real) | right.Value.Number.Integer;
                        Type                 = ExpressionType::IntegerNumber;
                        break;
                    }

                    case ExpressionType::RealNumber: {
                        Value.Number.Integer = SizeT64I(Value.Number.Real) | SizeT64I(right.Value.Number.Real);
                        Type                 = ExpressionType::IntegerNumber;
                    }

                    default: {
                    }
                }
            }

            default: {
            }
        }
    }